

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_regressor.cc
# Opt level: O0

void truncate<sparse_parameters>(vw *all,sparse_parameters *weights)

{
  int iVar1;
  iterator iVar2;
  iterator iVar3;
  sparse_parameters *in_stack_00000118;
  vw *in_stack_00000120;
  sparse_parameters *in_stack_ffffffffffffff90;
  
  if (truncate<sparse_parameters>(vw&,sparse_parameters&)::sd == '\0') {
    iVar1 = __cxa_guard_acquire(&truncate<sparse_parameters>(vw&,sparse_parameters&)::sd);
    if (iVar1 != 0) {
      truncate<sparse_parameters>::sd =
           calculate_sd<sparse_parameters>(in_stack_00000120,in_stack_00000118);
      in_stack_ffffffffffffff90 = (sparse_parameters *)truncate<sparse_parameters>::sd;
      __cxa_guard_release(&truncate<sparse_parameters>(vw&,sparse_parameters&)::sd);
    }
  }
  iVar2 = sparse_parameters::begin(in_stack_ffffffffffffff90);
  iVar3 = sparse_parameters::end(in_stack_ffffffffffffff90);
  std::
  for_each<sparse_iterator<float>,truncate<sparse_parameters>(vw&,sparse_parameters&)::_lambda(float&)_1_>
            (iVar2._iter.super__Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false>.
             _M_cur.super__Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false>,
             iVar2._stride,
             iVar3._iter.super__Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false>.
             _M_cur.super__Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false>,
             iVar3._stride);
  return;
}

Assistant:

void truncate(vw& all, T& weights)
{
  static double sd = calculate_sd(all, weights);
  for_each(weights.begin(), weights.end(), [](float& v) {
    if (abs(v) > sd * 2)
    {
      v = (float)std::remainder(v, sd * 2);
    }
  });
}